

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_attrib.cc
# Opt level: O2

X509_ATTRIBUTE * X509_ATTRIBUTE_new(void)

{
  X509_ATTRIBUTE *pXVar1;
  
  pXVar1 = (X509_ATTRIBUTE *)ASN1_item_new((ASN1_ITEM *)&X509_ATTRIBUTE_it);
  return pXVar1;
}

Assistant:

X509_ATTRIBUTE *X509_ATTRIBUTE_create(int nid, int attrtype, void *value) {
  ASN1_OBJECT *obj = OBJ_nid2obj(nid);
  if (obj == NULL) {
    return NULL;
  }

  X509_ATTRIBUTE *ret = X509_ATTRIBUTE_new();
  ASN1_TYPE *val = ASN1_TYPE_new();
  if (ret == NULL || val == NULL) {
    goto err;
  }

  ret->object = obj;
  if (!sk_ASN1_TYPE_push(ret->set, val)) {
    goto err;
  }

  ASN1_TYPE_set(val, attrtype, value);
  return ret;

err:
  X509_ATTRIBUTE_free(ret);
  ASN1_TYPE_free(val);
  return NULL;
}